

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O3

byte_view __thiscall winmd::reader::database::get_blob(database *this,uint32_t index)

{
  uint in_EDX;
  undefined4 in_register_00000034;
  long lVar1;
  byte_view bVar2;
  byte_view view;
  byte_view local_60 [3];
  
  lVar1 = CONCAT44(in_register_00000034,index);
  byte_view::check_available((byte_view *)(lVar1 + 0x650),in_EDX);
  local_60[0].m_first = (uint8_t *)((ulong)in_EDX + *(long *)(lVar1 + 0x650));
  local_60[0].m_last = *(uint8_t **)(lVar1 + 0x658);
  byte_view::check_available(local_60,1);
  bVar2 = (byte_view)
          (*(code *)(&DAT_001766c8 +
                    *(int *)(&DAT_001766c8 + (ulong)(*local_60[0].m_first >> 5) * 4)))();
  return bVar2;
}

Assistant:

byte_view get_blob(uint32_t const index) const
        {
            auto view = m_blobs.seek(index);
            auto initial_byte = view.as<uint8_t>();
            uint32_t blob_size_bytes{};

            switch (initial_byte >> 5)
            {
            case 0:
            case 1:
            case 2:
            case 3:
                blob_size_bytes = 1;
                initial_byte &= 0x7f;
                break;

            case 4:
            case 5:
                blob_size_bytes = 2;
                initial_byte &= 0x3f;
                break;

            case 6:
                blob_size_bytes = 4;
                initial_byte &= 0x1f;
                break;

            default:
                impl::throw_invalid("Invalid blob encoding");
            }

            uint32_t blob_size{ initial_byte };

            for (auto&& byte : view.sub(1, blob_size_bytes - 1))
            {
                blob_size = (blob_size << 8) + byte;
            }

            return { view.sub(blob_size_bytes, blob_size) };
        }